

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.h
# Opt level: O0

void __thiscall
TrodesMsg::addcontents<char_const*,unsigned_short>
          (TrodesMsg *this,string *f,char *head,unsigned_short tail)

{
  ulong uVar1;
  string *this_00;
  char extraout_var;
  char *in_RDX;
  ulong in_RSI;
  char in_DIL;
  string e;
  string *a;
  char c;
  TrodesMsg *in_stack_ffffffffffffff40;
  string *psVar2;
  string local_78 [30];
  unsigned_short in_stack_ffffffffffffffa6;
  string *in_stack_ffffffffffffffa8;
  TrodesMsg *in_stack_ffffffffffffffb0;
  allocator local_1b [3];
  char *local_18;
  
  local_18 = in_RDX;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator[](in_RSI);
    a = (string *)&stack0xffffffffffffffaf;
    c = extraout_var;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,local_18,(allocator *)a);
    appendArg(in_stack_ffffffffffffff40,c,a);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
    std::__cxx11::string::operator[](in_RSI);
    std::__cxx11::string::push_back(in_DIL);
    std::__cxx11::string::substr((ulong)local_78,in_RSI);
    addcontents<unsigned_short>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa6);
    std::__cxx11::string::~string(local_78);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  psVar2 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (this_00,"TrodesMsg Error: Mismatched format string and variables",local_1b);
  __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void addcontents(std::string f, H head, T... tail){
        try{
            if(f.empty())
                throw std::string("TrodesMsg Error: Mismatched format string and variables");
            appendArg(f[0], head);
            format.push_back(f[0]);
            addcontents(f.substr(1), tail...);
        } catch(std::string e){
            std::cerr << "[TrodesMsg::addcontents Error] " << e << "\n";
        } catch(...){
            std::cout << "[TrodesMsg::addcontents Error] Unknown exception thrown!\n";
        }
    }